

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O3

void __thiscall LexerTest_LexString_Test::TestBody(LexerTest_LexString_Test *this)

{
  bool bVar1;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  string_view buffer;
  string_view buffer_00;
  string_view buffer_01;
  string_view buffer_02;
  string_view buffer_03;
  string_view buffer_04;
  string_view buffer_05;
  string_view buffer_06;
  string_view buffer_07;
  string_view buffer_08;
  string_view buffer_09;
  string_view buffer_10;
  string_view buffer_11;
  string_view buffer_12;
  string_view buffer_13;
  string_view buffer_14;
  string_view buffer_15;
  string_view buffer_16;
  string_view buffer_17;
  undefined4 local_400 [4];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_3f0;
  bool local_3d0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_3c8;
  bool local_3a8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_3a0;
  bool local_380;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_378;
  bool local_358;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_350;
  bool local_330;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_328;
  bool local_308;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_300;
  bool local_2e0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2d8;
  bool local_2b8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2b0;
  bool local_290;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_288;
  bool local_268;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_260;
  bool local_240;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_238;
  bool local_218;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_210;
  bool local_1f0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1e8;
  bool local_1c8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1c0;
  bool local_1a0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_198;
  bool local_178;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_170;
  bool local_150;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_148;
  bool local_128;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_120;
  bool local_100;
  internal local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  AssertHelper local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_a8;
  bool local_88;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_50;
  bool local_30;
  
  local_3d0 = false;
  buffer._M_str = "\"The quick brown fox jumps over the lazy dog\"";
  buffer._M_len = 0x2d;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_3f0);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::optional<std::__cxx11::string>,char[44]>
            ((internal *)local_70,
             "Lexer(\"\\\"The quick brown fox jumps over the lazy dog\\\"\"sv).takeString()",
             "\"The quick brown fox jumps over the lazy dog\"",
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_50,(char (*) [44])"The quick brown fox jumps over the lazy dog");
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_3d0 == true) &&
     (local_3d0 = false,
     local_3f0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_3f0._M_value + 0x10))) {
    operator_delete((void *)local_3f0._M_value._M_dataplus._M_p,local_3f0._16_8_ + 1);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x386,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_3a8 = false;
  buffer_00._M_str = "\"`~!@#$%^&*()_-+0123456789|,.<>/?;:\'\"";
  buffer_00._M_len = 0x25;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_00,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_3c8);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::optional<std::__cxx11::string>,char[36]>
            ((internal *)local_70,
             "Lexer(\"\\\"`~!@#$%^&*()_-+0123456789|,.<>/?;:\'\\\"\"sv).takeString()",
             "\"`~!@#$%^&*()_-+0123456789|,.<>/?;:\'\"",
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_50,(char (*) [36])"`~!@#$%^&*()_-+0123456789|,.<>/?;:\'");
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_3a8 == true) &&
     (local_3a8 = false,
     local_3c8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_3c8._M_value + 0x10))) {
    operator_delete((void *)local_3c8._M_value._M_dataplus._M_p,local_3c8._16_8_ + 1);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x388,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_380 = false;
  buffer_01._M_str = "\"_\\t_\\n_\\r_\\\\_\\\"_\\\'_\"";
  buffer_01._M_len = 0x15;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_01,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_3a0);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::optional<std::__cxx11::string>,char[14]>
            ((internal *)local_70,
             "Lexer(\"\\\"_\\\\t_\\\\n_\\\\r_\\\\\\\\_\\\\\\\"_\\\\\'_\\\"\"sv).takeString()",
             "\"_\\t_\\n_\\r_\\\\_\\\"_\\\'_\"",
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_50,(char (*) [14])"_\t_\n_\r_\\_\"_\'_");
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_380 == true) &&
     (local_380 = false,
     local_3a0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_3a0._M_value + 0x10))) {
    operator_delete((void *)local_3a0._M_value._M_dataplus._M_p,local_3a0._16_8_ + 1);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x38a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_358 = false;
  buffer_02._M_str = "\"_\\00_\\07_\\20_\\5A_\\7F_\\ff_\\ffff_\"";
  buffer_02._M_len = 0x21;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_02,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_378);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_d8._0_6_ = 0x205f075f005f;
  local_d8._6_2_ = 0x5a5f;
  local_d8._8_6_ = 0xff5fff5f7f5f;
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000e;
  local_d8[0xe] = 0;
  local_400[0] = 0x5f6666;
  local_e8.data_ = (AssertHelperData *)local_d8;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_400);
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 == paVar3) {
    local_60._M_allocated_capacity._0_7_ = (undefined7)paVar3->_M_allocated_capacity;
    local_60._M_local_buf[7] = (char)(paVar3->_M_allocated_capacity >> 0x38);
    local_60._8_7_ = (undefined7)plVar2[3];
    local_60._M_local_buf[0xf] = (char)((ulong)plVar2[3] >> 0x38);
    local_70 = (undefined1  [8])&local_60;
  }
  else {
    local_60._M_allocated_capacity._0_7_ = (undefined7)paVar3->_M_allocated_capacity;
    local_60._M_local_buf[7] = (char)(paVar3->_M_allocated_capacity >> 0x38);
    local_70 = (undefined1  [8])*plVar2;
  }
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar2[1];
  *plVar2 = (long)paVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  testing::internal::CmpHelperEQ<std::optional<std::__cxx11::string>,std::__cxx11::string>
            (local_f8,
             "Lexer(\"\\\"_\\\\00_\\\\07_\\\\20_\\\\5A_\\\\7F_\\\\ff_\\\\ffff_\\\"\"sv).takeString()"
             ,"\"_\\0_\\7_ _Z_\\x7f_\\xff_\\xff\"s + \"ff_\"s",
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  if (local_70 != (undefined1  [8])&local_60) {
    operator_delete((void *)local_70,
                    CONCAT17(local_60._M_local_buf[7],local_60._M_allocated_capacity._0_7_) + 1);
  }
  if (local_e8.data_ != (AssertHelperData *)local_d8) {
    operator_delete(local_e8.data_,CONCAT26(local_d8._6_2_,local_d8._0_6_) + 1);
  }
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_358 == true) &&
     (local_358 = false,
     local_378._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_378._M_value + 0x10))) {
    operator_delete((void *)local_378._M_value._M_dataplus._M_p,local_378._16_8_ + 1);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x38c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_c8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_330 = false;
  buffer_03._M_str = "\"_\\u{24}_\\u{00a3}_\\u{20AC}_\\u{10348}_\"";
  buffer_03._M_len = 0x26;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_03,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_350);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_60._M_allocated_capacity._0_7_ = 0xe25fa3c25f245f;
  local_60._M_local_buf[7] = -0x7e;
  local_60._8_7_ = 0x5f888d90f05fac;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf;
  local_60._M_local_buf[0xf] = '\0';
  local_70 = (undefined1  [8])&local_60;
  testing::internal::CmpHelperEQ<std::optional<std::__cxx11::string>,std::__cxx11::string>
            ((internal *)&local_e8,
             "Lexer(\"\\\"_\\\\u{24}_\\\\u{00a3}_\\\\u{20AC}_\\\\u{10348}_\\\"\"sv).takeString()",
             "\"_$_\\xC2\\xA3_\\xE2\\x82\\xAC_\\xF0\\x90\\x8D\\x88_\"s",
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  if (local_70 != (undefined1  [8])&local_60) {
    operator_delete((void *)local_70,
                    CONCAT17(local_60._M_local_buf[7],local_60._M_allocated_capacity._0_7_) + 1);
  }
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_330 == true) &&
     (local_330 = false,
     local_350._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_350._M_value + 0x10))) {
    operator_delete((void *)local_350._M_value._M_dataplus._M_p,local_350._16_8_ + 1);
  }
  if (local_e8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x390,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_308 = false;
  buffer_04._M_str = anon_var_dwarf_54d16e;
  buffer_04._M_len = 0x11;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_04,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_328);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_60._M_allocated_capacity._0_7_ = 0xe25fa3c25f245f;
  local_60._M_local_buf[7] = -0x7e;
  local_60._8_7_ = 0x5f888d90f05fac;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf;
  local_60._M_local_buf[0xf] = '\0';
  local_70 = (undefined1  [8])&local_60;
  testing::internal::CmpHelperEQ<std::optional<std::__cxx11::string>,std::__cxx11::string>
            ((internal *)&local_e8,
             "Lexer(\"\\\"_$_\\xC2\\xA3_\\xE2\\x82\\xAC_\\xF0\\x90\\x8D\\x88_\\\"\"sv).takeString()"
             ,"\"_$_\\xC2\\xA3_\\xE2\\x82\\xAC_\\xF0\\x90\\x8D\\x88_\"s",
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  if (local_70 != (undefined1  [8])&local_60) {
    operator_delete((void *)local_70,
                    CONCAT17(local_60._M_local_buf[7],local_60._M_allocated_capacity._0_7_) + 1);
  }
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_308 == true) &&
     (local_308 = false,
     local_328._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_328._M_value + 0x10))) {
    operator_delete((void *)local_328._M_value._M_dataplus._M_p,local_328._16_8_ + 1);
  }
  if (local_e8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x393,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_2e0 = false;
  buffer_05._M_str = "\"unterminated";
  buffer_05._M_len = 0xd;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_05,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_300);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_70 = (undefined1  [8])(CONCAT71(local_70._1_7_,local_30) ^ 1);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_2e0 == true) &&
     (local_2e0 = false,
     local_300._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_300._M_value + 0x10))) {
    operator_delete((void *)local_300._M_value._M_dataplus._M_p,local_300._16_8_ + 1);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_70,
               (AssertionResult *)"Lexer(\"\\\"unterminated\"sv).takeString()","true","false",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x395,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)
       ) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
    }
    if (local_50._M_value._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_50._M_value._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_2b8 = false;
  buffer_06._M_str = "\"unescaped nul";
  buffer_06._M_len = 0x10;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_06,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2d8);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_70 = (undefined1  [8])(CONCAT71(local_70._1_7_,local_30) ^ 1);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_2b8 == true) &&
     (local_2b8 = false,
     local_2d8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_2d8._M_value + 0x10))) {
    operator_delete((void *)local_2d8._M_value._M_dataplus._M_p,local_2d8._16_8_ + 1);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_70,
               (AssertionResult *)"Lexer(\"\\\"unescaped nul\\0\\\"\"sv).takeString()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x396,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_c8._0_8_ != (long)local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
    }
    if (local_50._M_value._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_50._M_value._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_290 = false;
  buffer_07._M_str = "\"unescaped U+19\x19\"";
  buffer_07._M_len = 0x11;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_07,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2b0);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_70 = (undefined1  [8])(CONCAT71(local_70._1_7_,local_30) ^ 1);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_290 == true) &&
     (local_290 = false,
     local_2b0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_2b0._M_value + 0x10))) {
    operator_delete((void *)local_2b0._M_value._M_dataplus._M_p,local_2b0._16_8_ + 1);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_70,
               (AssertionResult *)"Lexer(\"\\\"unescaped U+19\\x19\\\"\"sv).takeString()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x397,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)
       ) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
    }
    if (local_50._M_value._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_50._M_value._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_268 = false;
  buffer_08._M_str = "\"unescaped U+7f\x7f\"";
  buffer_08._M_len = 0x11;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_08,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_288);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_70 = (undefined1  [8])(CONCAT71(local_70._1_7_,local_30) ^ 1);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_268 == true) &&
     (local_268 = false,
     local_288._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_288._M_value + 0x10))) {
    operator_delete((void *)local_288._M_value._M_dataplus._M_p,local_288._16_8_ + 1);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_70,
               (AssertionResult *)"Lexer(\"\\\"unescaped U+7f\\x7f\\\"\"sv).takeString()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x398,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)
       ) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
    }
    if (local_50._M_value._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_50._M_value._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_240 = false;
  buffer_09._M_str = "\"\\ stray backslash\"";
  buffer_09._M_len = 0x13;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_09,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_260);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_70 = (undefined1  [8])(CONCAT71(local_70._1_7_,local_30) ^ 1);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_240 == true) &&
     (local_240 = false,
     local_260._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_260._M_value + 0x10))) {
    operator_delete((void *)local_260._M_value._M_dataplus._M_p,local_260._16_8_ + 1);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_70,
               (AssertionResult *)"Lexer(\"\\\"\\\\ stray backslash\\\"\"sv).takeString()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x399,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)
       ) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
    }
    if (local_50._M_value._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_50._M_value._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_218 = false;
  buffer_10._M_str = "\"short \\f hex escape\"";
  buffer_10._M_len = 0x15;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_10,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_238);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_70 = (undefined1  [8])(CONCAT71(local_70._1_7_,local_30) ^ 1);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_218 == true) &&
     (local_218 = false,
     local_238._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_238._M_value + 0x10))) {
    operator_delete((void *)local_238._M_value._M_dataplus._M_p,local_238._16_8_ + 1);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_70,
               (AssertionResult *)"Lexer(\"\\\"short \\\\f hex escape\\\"\"sv).takeString()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x39a,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_c8._0_8_ != (long)local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
    }
    if (local_50._M_value._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_50._M_value._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_1f0 = false;
  buffer_11._M_str = "\"bad hex \\gg\"";
  buffer_11._M_len = 0xd;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_11,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_210);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_70 = (undefined1  [8])(CONCAT71(local_70._1_7_,local_30) ^ 1);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_1f0 == true) &&
     (local_1f0 = false,
     local_210._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_210._M_value + 0x10))) {
    operator_delete((void *)local_210._M_value._M_dataplus._M_p,local_210._16_8_ + 1);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_70,
               (AssertionResult *)"Lexer(\"\\\"bad hex \\\\gg\\\"\"sv).takeString()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x39b,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)
       ) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
    }
    if (local_50._M_value._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_50._M_value._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_1c8 = false;
  buffer_12._M_str = "\"empty unicode \\u{}\"";
  buffer_12._M_len = 0x14;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_12,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1e8);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_70 = (undefined1  [8])(CONCAT71(local_70._1_7_,local_30) ^ 1);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_1c8 == true) &&
     (local_1c8 = false,
     local_1e8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1e8._M_value + 0x10))) {
    operator_delete((void *)local_1e8._M_value._M_dataplus._M_p,local_1e8._16_8_ + 1);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_70,
               (AssertionResult *)"Lexer(\"\\\"empty unicode \\\\u{}\\\"\"sv).takeString()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x39c,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)
       ) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
    }
    if (local_50._M_value._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_50._M_value._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_1a0 = false;
  buffer_13._M_str = "\"not unicode \\u{abcdefg}\"";
  buffer_13._M_len = 0x19;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_13,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1c0);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_70 = (undefined1  [8])(CONCAT71(local_70._1_7_,local_30) ^ 1);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_1a0 == true) &&
     (local_1a0 = false,
     local_1c0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1c0._M_value + 0x10))) {
    operator_delete((void *)local_1c0._M_value._M_dataplus._M_p,local_1c0._16_8_ + 1);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_70,
               (AssertionResult *)"Lexer(\"\\\"not unicode \\\\u{abcdefg}\\\"\"sv).takeString()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x39d,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)
       ) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
    }
    if (local_50._M_value._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_50._M_value._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_178 = false;
  buffer_14._M_str = "\"extra chars \\u{123(}\"";
  buffer_14._M_len = 0x16;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_14,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_198);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_70 = (undefined1  [8])(CONCAT71(local_70._1_7_,local_30) ^ 1);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_178 == true) &&
     (local_178 = false,
     local_198._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_198._M_value + 0x10))) {
    operator_delete((void *)local_198._M_value._M_dataplus._M_p,local_198._16_8_ + 1);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_70,
               (AssertionResult *)"Lexer(\"\\\"extra chars \\\\u{123(}\\\"\"sv).takeString()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x39e,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_c8._0_8_ != (long)local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
    }
    if (local_50._M_value._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_50._M_value._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_150 = false;
  buffer_15._M_str = "\"unpaired surrogate unicode crimes \\u{d800}\"";
  buffer_15._M_len = 0x2c;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_15,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_170);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_70 = (undefined1  [8])(CONCAT71(local_70._1_7_,local_30) ^ 1);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_150 == true) &&
     (local_150 = false,
     local_170._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_170._M_value + 0x10))) {
    operator_delete((void *)local_170._M_value._M_dataplus._M_p,local_170._16_8_ + 1);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_70,
               (AssertionResult *)
               "Lexer(\"\\\"unpaired surrogate unicode crimes \\\\u{d800}\\\"\"sv).takeString()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x3a0,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)
       ) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
    }
    if (local_50._M_value._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_50._M_value._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_128 = false;
  buffer_16._M_str = "\"more surrogate unicode crimes \\u{dfff}\"";
  buffer_16._M_len = 0x28;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_16,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_148);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  local_70 = (undefined1  [8])(CONCAT71(local_70._1_7_,local_30) ^ 1);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_128 == true) &&
     (local_128 = false,
     local_148._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_148._M_value + 0x10))) {
    operator_delete((void *)local_148._M_value._M_dataplus._M_p,local_148._16_8_ + 1);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_70,
               (AssertionResult *)
               "Lexer(\"\\\"more surrogate unicode crimes \\\\u{dfff}\\\"\"sv).takeString()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x3a2,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)
       ) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
    }
    if (local_50._M_value._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_50._M_value._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_100 = false;
  buffer_17._M_str = "\"too big \\u{110000}\"";
  buffer_17._M_len = 0x14;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_c8,buffer_17,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_120);
  ::wasm::WATParser::Lexer::takeString_abi_cxx11_();
  bVar1 = local_30;
  local_70 = (undefined1  [8])(CONCAT71(local_70._1_7_,local_30) ^ 1);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_30 == true) &&
     (local_30 = false,
     local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10))) {
    operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
  }
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_b8._8_8_ - local_c8._8_8_);
  }
  if ((local_100 == true) &&
     (local_100 = false,
     local_120._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_120._M_value + 0x10))) {
    operator_delete((void *)local_120._M_value._M_dataplus._M_p,local_120._16_8_ + 1);
  }
  if (bVar1 != false) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_70,
               (AssertionResult *)"Lexer(\"\\\"too big \\\\u{110000}\\\"\"sv).takeString()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x3a3,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_c8._0_8_ != (long)local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._M_allocated_capacity + 1));
    }
    if (local_50._M_value._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_50._M_value._M_dataplus._M_p + 8))();
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
  }
  return;
}

Assistant:

TEST(LexerTest, LexString) {
  using namespace std::string_literals;
  EXPECT_EQ(
    Lexer("\"The quick brown fox jumps over the lazy dog\""sv).takeString(),
    "The quick brown fox jumps over the lazy dog");
  EXPECT_EQ(Lexer("\"`~!@#$%^&*()_-+0123456789|,.<>/?;:'\""sv).takeString(),
            "`~!@#$%^&*()_-+0123456789|,.<>/?;:'");
  EXPECT_EQ(Lexer("\"_\\t_\\n_\\r_\\\\_\\\"_\\'_\""sv).takeString(),
            "_\t_\n_\r_\\_\"_\'_");
  EXPECT_EQ(Lexer("\"_\\00_\\07_\\20_\\5A_\\7F_\\ff_\\ffff_\""sv).takeString(),
            "_\0_\7_ _Z_\x7f_\xff_\xff"s + "ff_"s);
  // _$_£_€_𐍈_
  EXPECT_EQ(
    Lexer("\"_\\u{24}_\\u{00a3}_\\u{20AC}_\\u{10348}_\""sv).takeString(),
    "_$_\xC2\xA3_\xE2\x82\xAC_\xF0\x90\x8D\x88_"s);
  EXPECT_EQ(
    Lexer("\"_$_\xC2\xA3_\xE2\x82\xAC_\xF0\x90\x8D\x88_\""sv).takeString(),
    "_$_\xC2\xA3_\xE2\x82\xAC_\xF0\x90\x8D\x88_"s);

  EXPECT_FALSE(Lexer("\"unterminated"sv).takeString());
  EXPECT_FALSE(Lexer("\"unescaped nul\0\""sv).takeString());
  EXPECT_FALSE(Lexer("\"unescaped U+19\x19\""sv).takeString());
  EXPECT_FALSE(Lexer("\"unescaped U+7f\x7f\""sv).takeString());
  EXPECT_FALSE(Lexer("\"\\ stray backslash\""sv).takeString());
  EXPECT_FALSE(Lexer("\"short \\f hex escape\""sv).takeString());
  EXPECT_FALSE(Lexer("\"bad hex \\gg\""sv).takeString());
  EXPECT_FALSE(Lexer("\"empty unicode \\u{}\""sv).takeString());
  EXPECT_FALSE(Lexer("\"not unicode \\u{abcdefg}\""sv).takeString());
  EXPECT_FALSE(Lexer("\"extra chars \\u{123(}\""sv).takeString());
  EXPECT_FALSE(
    Lexer("\"unpaired surrogate unicode crimes \\u{d800}\""sv).takeString());
  EXPECT_FALSE(
    Lexer("\"more surrogate unicode crimes \\u{dfff}\""sv).takeString());
  EXPECT_FALSE(Lexer("\"too big \\u{110000}\""sv).takeString());
}